

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall
QWidgetPrivate::paintBackground
          (QWidgetPrivate *this,QPainter *painter,QRegion *rgn,DrawWidgetFlags flags)

{
  bool bVar1;
  undefined1 uVar2;
  Int IVar3;
  QWidget *pQVar4;
  QWidget *this_00;
  QBrush *pQVar5;
  QStyle *pQVar6;
  QBrush *in_RDX;
  QBrush *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  CompositionMode oldMode;
  bool brushOriginSet;
  QWidget *q;
  QBrush bg;
  QBrush autoFillBrush;
  QStyleOption opt;
  undefined4 in_stack_ffffffffffffff48;
  DrawWidgetFlag in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  ClipOperation CVar7;
  QWidgetPrivate *painter_00;
  undefined4 in_stack_ffffffffffffff90;
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> in_stack_ffffffffffffff94;
  undefined1 *local_68;
  QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4> local_5c;
  undefined1 *local_58 [2];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  painter_00 = in_RDI;
  pQVar4 = q_func(in_RDI);
  in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c & 0xffffff;
  local_58[0] = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QWidget *)QWidget::palette((QWidget *)in_RDI);
  QWidget::backgroundRole(this_00);
  pQVar5 = QPalette::brush((QPalette *)in_RDI,in_stack_ffffffffffffff4c);
  QBrush::QBrush((QBrush *)local_58,pQVar5);
  local_5c.super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i =
       (QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>)
       QFlags<QWidgetPrivate::DrawWidgetFlag>::operator&
                 ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_RDI,in_stack_ffffffffffffff4c);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_5c);
  in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 & 0xffffff;
  if (IVar3 != 0) {
    bVar1 = QWidget::autoFillBackground((QWidget *)in_RDI);
    in_stack_ffffffffffffff4c = in_stack_ffffffffffffff4c & 0xffffff;
    if (bVar1) {
      uVar2 = QBrush::isOpaque();
      in_stack_ffffffffffffff4c = CONCAT13(uVar2,(int3)in_stack_ffffffffffffff4c);
    }
    in_stack_ffffffffffffff64 =
         CONCAT13((char)(in_stack_ffffffffffffff4c >> 0x18),(int3)in_stack_ffffffffffffff64) ^
         0xff000000;
  }
  if ((in_stack_ffffffffffffff64 & 0x1000000) != 0) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::palette((QWidget *)in_RDI);
    pQVar5 = QPalette::brush((QPalette *)in_RDI,in_stack_ffffffffffffff4c);
    QBrush::QBrush((QBrush *)&local_68,pQVar5);
    if ((in_stack_ffffffffffffff6c & 0x1000000) == 0) {
      bVar1 = updateBrushOrigin((QWidgetPrivate *)
                                CONCAT44(in_stack_ffffffffffffff94.i,in_stack_ffffffffffffff90),
                                (QPainter *)painter_00,in_RSI);
      in_stack_ffffffffffffff6c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff6c);
    }
    in_stack_ffffffffffffff94.i =
         (Int)QFlags<QWidgetPrivate::DrawWidgetFlag>::operator&
                        ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)in_RDI,in_stack_ffffffffffffff4c)
    ;
    bVar1 = QFlags<QWidgetPrivate::DrawWidgetFlag>::operator!
                      ((QFlags<QWidgetPrivate::DrawWidgetFlag> *)&stack0xffffffffffffff94);
    if (bVar1) {
      in_stack_ffffffffffffff68 = QPainter::compositionMode();
      QPainter::setCompositionMode((CompositionMode)in_RSI);
      fillRegion((QPainter *)painter_00,(QRegion *)in_RSI,in_RDX);
      QPainter::setCompositionMode((CompositionMode)in_RSI);
    }
    else {
      fillRegion((QPainter *)painter_00,(QRegion *)in_RSI,in_RDX);
    }
    QBrush::~QBrush((QBrush *)&local_68);
  }
  bVar1 = QWidget::autoFillBackground((QWidget *)in_RDI);
  if (bVar1) {
    if ((in_stack_ffffffffffffff6c & 0x1000000) == 0) {
      bVar1 = updateBrushOrigin((QWidgetPrivate *)
                                CONCAT44(in_stack_ffffffffffffff94.i,in_stack_ffffffffffffff90),
                                (QPainter *)painter_00,in_RSI);
      in_stack_ffffffffffffff6c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff6c);
    }
    fillRegion((QPainter *)painter_00,(QRegion *)in_RSI,in_RDX);
  }
  CVar7 = (ClipOperation)in_RDX;
  bVar1 = QWidget::testAttribute(this_00,(WidgetAttribute)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    QPainter::setClipRegion((QRegion *)in_RSI,CVar7);
    memset(local_48,0xaa,0x40);
    QStyleOption::QStyleOption
              ((QStyleOption *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    QStyleOption::initFrom
              ((QStyleOption *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (QWidget *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                           );
    (**(code **)(*(long *)pQVar6 + 0xb0))(pQVar6,0x29,local_48,in_RSI,pQVar4);
    QStyleOption::~QStyleOption((QStyleOption *)in_RDI);
  }
  QBrush::~QBrush((QBrush *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::paintBackground(QPainter *painter, const QRegion &rgn, DrawWidgetFlags flags) const
{
    Q_Q(const QWidget);

    bool brushOriginSet = false;
    const QBrush autoFillBrush = q->palette().brush(q->backgroundRole());

    if ((flags & DrawAsRoot) && !(q->autoFillBackground() && autoFillBrush.isOpaque())) {
        const QBrush bg = q->palette().brush(QPalette::Window);
        if (!brushOriginSet)
            brushOriginSet = updateBrushOrigin(painter, bg);
        if (!(flags & DontSetCompositionMode)) {
            //copy alpha straight in
            QPainter::CompositionMode oldMode = painter->compositionMode();
            painter->setCompositionMode(QPainter::CompositionMode_Source);
            fillRegion(painter, rgn, bg);
            painter->setCompositionMode(oldMode);
        } else {
            fillRegion(painter, rgn, bg);
        }
    }

    if (q->autoFillBackground()) {
        if (!brushOriginSet)
            brushOriginSet = updateBrushOrigin(painter, autoFillBrush);
        fillRegion(painter, rgn, autoFillBrush);
    }

    if (q->testAttribute(Qt::WA_StyledBackground)) {
        painter->setClipRegion(rgn);
        QStyleOption opt;
        opt.initFrom(q);
        q->style()->drawPrimitive(QStyle::PE_Widget, &opt, painter, q);
    }
}